

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O0

int __thiscall TPZString::Replace(TPZString *this,char *replace_str,char *new_substr)

{
  char *__dest;
  int iVar1;
  size_t sVar2;
  char *__src;
  char *in_RSI;
  long in_RDI;
  size_type pos;
  int count;
  int replace_len;
  string newstring;
  ulong local_60;
  int local_54;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [40];
  char *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  sVar2 = strlen(local_10);
  iVar1 = (int)sVar2;
  local_54 = 0;
  local_60 = std::__cxx11::string::find((char *)local_38,(ulong)local_10);
  while (local_60 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_38,local_60,(char *)(long)iVar1);
    local_60 = std::__cxx11::string::find((char *)local_38,(ulong)local_10);
    local_54 = local_54 + 1;
  }
  if (local_54 != 0) {
    __dest = *(char **)(in_RDI + 8);
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(__dest,__src,*(size_t *)(in_RDI + 0x10));
  }
  std::__cxx11::string::~string(local_38);
  return local_54;
}

Assistant:

int TPZString::Replace( const char * replace_str, const char *new_substr){
	string newstring(fStore);
	const int replace_len = strlen(replace_str);
	int  count = 0;
	string::size_type pos = newstring.find(replace_str, 0);
	while( pos!= string::npos) {
		newstring.replace(pos, replace_len, new_substr);
		pos = newstring.find(replace_str, 0);
		count++;
	}
	if(count) strncpy(fStore, newstring.c_str(), fNElements);
	return(count);
}